

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

void __thiscall Character::ShowBoard(Character *this,Board *board)

{
  double dVar1;
  World *pWVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  list<Board_Post_*,_std::allocator<Board_Post_*>_> *plVar8;
  int *piVar9;
  reference ppBVar10;
  string *__lhs;
  key_type *__k;
  double dVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  allocator<char> local_219;
  key_type local_218;
  undefined1 local_1f8 [8];
  string subject_extra;
  undefined1 local_1b8 [8];
  string author_extra;
  Board_Post *post_1;
  iterator __end1_1;
  iterator __begin1_1;
  list<Board_Post_*,_std::allocator<Board_Post_*>_> *__range1_1;
  key_type local_170;
  int local_150;
  allocator<char> local_149;
  key_type local_148;
  int local_124;
  int local_120;
  allocator<char> local_119;
  int posts_remaining;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  Board_Post *local_d8;
  Board_Post *post;
  iterator __end1;
  iterator __begin1;
  list<Board_Post_*,_std::allocator<Board_Post_*>_> *__range1;
  int local_b0;
  int recent_post_count;
  int post_count;
  undefined1 local_88 [8];
  PacketBuilder builder;
  allocator<char> local_41;
  key_type local_40;
  int local_1c;
  Board *pBStack_18;
  int date_res;
  Board *board_local;
  Character *this_local;
  
  pBStack_18 = board;
  if (board == (Board *)0x0) {
    pBStack_18 = this->board;
  }
  pWVar2 = this->world;
  board_local = (Board *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"BoardDatePosts",&local_41)
  ;
  pmVar6 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar2->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_40);
  bVar3 = util::variant::operator_cast_to_bool(pmVar6);
  local_1c = 0;
  if (bVar3) {
    local_1c = 0x11;
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  sVar7 = std::__cxx11::list<Board_Post_*,_std::allocator<Board_Post_*>_>::size(&pBStack_18->posts);
  pWVar2 = this->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&post_count,"BoardMaxSubjectLength",
             (allocator<char> *)((long)&recent_post_count + 3));
  pmVar6 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar2->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,(key_type *)&post_count);
  iVar5 = util::variant::operator_cast_to_int(pmVar6);
  PacketBuilder::PacketBuilder
            ((PacketBuilder *)local_88,PACKET_BOARD,PACKET_OPEN,
             sVar7 * (long)(iVar5 + 0x11 + local_1c) + 2);
  std::__cxx11::string::~string((string *)&post_count);
  std::allocator<char>::~allocator((allocator<char> *)((long)&recent_post_count + 3));
  PacketBuilder::AddChar((PacketBuilder *)local_88,pBStack_18->id + 1);
  sVar7 = std::__cxx11::list<Board_Post_*,_std::allocator<Board_Post_*>_>::size(&pBStack_18->posts);
  PacketBuilder::AddChar((PacketBuilder *)local_88,(int)sVar7);
  local_b0 = 0;
  __range1._4_4_ = 0;
  plVar8 = &pBStack_18->posts;
  __end1 = std::__cxx11::list<Board_Post_*,_std::allocator<Board_Post_*>_>::begin(plVar8);
  post = (Board_Post *)std::__cxx11::list<Board_Post_*,_std::allocator<Board_Post_*>_>::end(plVar8);
  while (bVar3 = std::operator!=(&__end1,(_Self *)&post), bVar3) {
    ppBVar10 = std::_List_iterator<Board_Post_*>::operator*(&__end1);
    local_d8 = *ppBVar10;
    __lhs = &local_d8->author;
    (*(this->player->character->super_Command_Source)._vptr_Command_Source[2])(&local_f8);
    _Var4 = std::operator==(__lhs,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    if (_Var4) {
      local_b0 = local_b0 + 1;
      dVar1 = local_d8->time;
      pWVar2 = this->world;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&posts_remaining,"BoardRecentPostTime",&local_119);
      pmVar6 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::operator[](&(pWVar2->config).
                             super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                            ,(key_type *)&posts_remaining);
      iVar5 = util::variant::operator_cast_to_int(pmVar6);
      dVar11 = Timer::GetTime();
      std::__cxx11::string::~string((string *)&posts_remaining);
      std::allocator<char>::~allocator(&local_119);
      if (dVar11 < dVar1 + (double)iVar5) {
        __range1._4_4_ = __range1._4_4_ + 1;
      }
    }
    std::_List_iterator<Board_Post_*>::operator++(&__end1);
  }
  pWVar2 = this->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"BoardMaxUserPosts",&local_149);
  pmVar6 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar2->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_148);
  local_124 = util::variant::operator_cast_to_int(pmVar6);
  local_124 = local_124 - local_b0;
  pWVar2 = this->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"BoardMaxUserRecentPosts",
             (allocator<char> *)((long)&__range1_1 + 7));
  pmVar6 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar2->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_170);
  local_150 = util::variant::operator_cast_to_int(pmVar6);
  local_150 = local_150 - __range1._4_4_;
  piVar9 = std::min<int>(&local_124,&local_150);
  iVar5 = *piVar9;
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  plVar8 = &pBStack_18->posts;
  local_120 = iVar5;
  __end1_1 = std::__cxx11::list<Board_Post_*,_std::allocator<Board_Post_*>_>::begin(plVar8);
  post_1 = (Board_Post *)
           std::__cxx11::list<Board_Post_*,_std::allocator<Board_Post_*>_>::end(plVar8);
  while (bVar3 = std::operator!=(&__end1_1,(_Self *)&post_1), bVar3) {
    ppBVar10 = std::_List_iterator<Board_Post_*>::operator*(&__end1_1);
    author_extra.field_2._8_8_ = *ppBVar10;
    PacketBuilder::AddShort
              ((PacketBuilder *)local_88,(int)((Board_Post *)author_extra.field_2._8_8_)->id);
    PacketBuilder::AddByte((PacketBuilder *)local_88,0xff);
    std::__cxx11::string::string((string *)local_1b8);
    if (0 < local_120) {
      std::__cxx11::string::operator=((string *)local_1b8," ");
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&subject_extra.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (author_extra.field_2._8_8_ + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
    PacketBuilder::AddBreakString
              ((PacketBuilder *)local_88,(string *)((long)&subject_extra.field_2 + 8),0xff);
    std::__cxx11::string::~string((string *)(subject_extra.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_1f8);
    pWVar2 = this->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,"BoardDatePosts",&local_219);
    __k = &local_218;
    pmVar6 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(pWVar2->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,__k);
    bVar3 = util::variant::operator_cast_to_bool(pmVar6);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_219);
    if (bVar3) {
      dVar1 = *(double *)(author_extra.field_2._8_8_ + 0x70);
      dVar11 = Timer::GetTime();
      util::timeago_abi_cxx11_(&local_280,(util *)__k,dVar1,dVar11);
      std::operator+(&local_260," (",&local_280);
      std::operator+(&local_240,&local_260,")");
      std::__cxx11::string::operator=((string *)local_1f8,(string *)&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_280);
    }
    std::operator+(&local_2a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (author_extra.field_2._8_8_ + 0x30),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
    PacketBuilder::AddBreakString((PacketBuilder *)local_88,&local_2a0,0xff);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)local_1f8);
    std::__cxx11::string::~string((string *)local_1b8);
    std::_List_iterator<Board_Post_*>::operator++(&__end1_1);
  }
  Send(this,(PacketBuilder *)local_88);
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_88);
  return;
}

Assistant:

void Character::ShowBoard(Board *board)
{
	if (!board)
	{
		board = this->board;
	}

	const int date_res = (this->world->config["BoardDatePosts"]) ? 17 : 0;

	PacketBuilder builder(PACKET_BOARD, PACKET_OPEN, 2 + board->posts.size() * (17 + int(this->world->config["BoardMaxSubjectLength"]) + date_res));
	builder.AddChar(board->id + 1);
	builder.AddChar(board->posts.size());

	int post_count = 0;
	int recent_post_count = 0;

	UTIL_FOREACH(board->posts, post)
	{
		if (post->author == this->player->character->SourceName())
		{
			++post_count;

			if (post->time + static_cast<int>(this->world->config["BoardRecentPostTime"]) > Timer::GetTime())
			{
				++recent_post_count;
			}
		}
	}

	int posts_remaining = std::min(static_cast<int>(this->world->config["BoardMaxUserPosts"]) - post_count, static_cast<int>(this->world->config["BoardMaxUserRecentPosts"]) - recent_post_count);

	UTIL_FOREACH(board->posts, post)
	{
		builder.AddShort(post->id);
		builder.AddByte(255);

		std::string author_extra;

		if (posts_remaining > 0)
		{
			author_extra = " ";
		}

		builder.AddBreakString(post->author + author_extra);

		std::string subject_extra;

		if (this->world->config["BoardDatePosts"])
		{
			subject_extra = " (" + util::timeago(post->time, Timer::GetTime()) + ")";
		}

		builder.AddBreakString(post->subject + subject_extra);
	}

	this->Send(builder);
}